

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O0

void __thiscall QKmsScreenConfig::loadConfig(QKmsScreenConfig *this)

{
  QLatin1StringView str_00;
  QLatin1StringView str_01;
  bool bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  QAnyStringView *this_00;
  QMessageLogger *this_01;
  int *piVar5;
  undefined8 uVar6;
  QArrayDataPointer<char16_t> *this_02;
  long lVar7;
  QDebug *o;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1String QVar8;
  QLatin1String QVar9;
  QLatin1String QVar10;
  QLatin1String QVar11;
  QLatin1String QVar12;
  QLatin1String QVar13;
  QLatin1String QVar14;
  int i;
  char16_t *str_1;
  char16_t *str;
  QString name;
  QVariantMap outputSettings;
  QJsonArray outputs;
  QAnyStringView vdOriString;
  QSize headlessSize;
  QByteArray headless;
  QString headlessStr;
  QJsonObject object;
  QJsonDocument doc;
  QFile file;
  QByteArray json;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_5;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_4;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_fffffffffffffad8;
  OpenModeFlag in_stack_fffffffffffffadc;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_stack_fffffffffffffae0;
  QByteArray *in_stack_fffffffffffffae8;
  QMessageLogger *in_stack_fffffffffffffaf0;
  iterator in_stack_fffffffffffffb00;
  int local_4f4;
  QLatin1StringView in_stack_fffffffffffffb20;
  QDebug local_400;
  QDebug local_3f8;
  QDebug local_3f0 [5];
  QDebug local_3c8;
  QArrayDataPointer<char16_t> local_3c0 [2];
  undefined8 local_390;
  undefined8 local_388;
  undefined8 local_380;
  QArrayDataPointer<char16_t> local_378 [2];
  QJsonObject local_348 [8];
  undefined8 local_340;
  undefined8 local_338;
  QString local_330;
  char local_318 [64];
  QAnyStringView local_2d8;
  undefined1 local_2c8 [16];
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined8 local_270;
  undefined8 local_268 [5];
  QDebug local_240;
  QJsonParseError local_238 [24];
  undefined8 local_220 [5];
  QDebug local_1f8 [2];
  undefined1 local_1e8 [24];
  undefined8 local_1d0;
  undefined8 local_1c8;
  QDebug local_1a0;
  char local_198 [24];
  char local_180 [24];
  undefined8 local_168;
  ulong local_160;
  undefined8 local_158;
  ulong local_150;
  QJsonValue local_148 [24];
  QJsonValue local_130 [24];
  undefined8 local_118;
  ulong local_110;
  QJsonValue local_108 [24];
  QJsonValue local_f0 [24];
  QJsonValue local_d8 [24];
  QJsonValue local_c0 [24];
  QJsonValue local_a8 [24];
  QJsonValue local_90 [24];
  undefined8 local_78;
  ulong local_70;
  undefined8 local_68;
  ulong local_60;
  undefined8 local_58;
  ulong local_50;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_180[0] = -0x56;
  local_180[1] = -0x56;
  local_180[2] = -0x56;
  local_180[3] = -0x56;
  local_180[4] = -0x56;
  local_180[5] = -0x56;
  local_180[6] = -0x56;
  local_180[7] = -0x56;
  local_180[8] = -0x56;
  local_180[9] = -0x56;
  local_180[10] = -0x56;
  local_180[0xb] = -0x56;
  local_180[0xc] = -0x56;
  local_180[0xd] = -0x56;
  local_180[0xe] = -0x56;
  local_180[0xf] = -0x56;
  local_180[0x10] = -0x56;
  local_180[0x11] = -0x56;
  local_180[0x12] = -0x56;
  local_180[0x13] = -0x56;
  local_180[0x14] = -0x56;
  local_180[0x15] = -0x56;
  local_180[0x16] = -0x56;
  local_180[0x17] = -0x56;
  qgetenv(local_180);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x11b7af);
  if (bVar1) {
    qgetenv(local_198);
    QByteArray::operator=
              ((QByteArray *)in_stack_fffffffffffffae0,
               (QByteArray *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
    QByteArray::~QByteArray((QByteArray *)0x11b7eb);
    bVar1 = QByteArray::isEmpty((QByteArray *)0x11b7f8);
    if (bVar1) goto LAB_0011c77f;
  }
  local_58 = 0xaaaaaaaaaaaaaaaa;
  local_50 = 0xaaaaaaaaaaaaaaaa;
  qLcKmsDebug();
  anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffae0,
             (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_58), bVar1) {
    anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x11b863);
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffaf0,(char *)in_stack_fffffffffffffae8,
               (int)((ulong)in_stack_fffffffffffffae0 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
               (char *)0x11b87c);
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffb20.m_data);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    QDebug::~QDebug(&local_1a0);
    local_50 = local_50 & 0xffffffffffffff00;
  }
  local_1d0 = 0xaaaaaaaaaaaaaaaa;
  local_1c8 = 0xaaaaaaaaaaaaaaaa;
  QString::fromUtf8<void>((QByteArray *)in_stack_fffffffffffffae0);
  QFile::QFile((QFile *)&local_1d0,(QString *)local_1e8);
  QString::~QString((QString *)0x11b924);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffae0,
             in_stack_fffffffffffffadc);
  uVar4 = QFile::open((QFlags_conflict *)&local_1d0);
  if ((uVar4 & 1) == 0) {
    local_68 = 0xaaaaaaaaaaaaaaaa;
    local_60 = 0xaaaaaaaaaaaaaaaa;
    qLcKmsDebug();
    anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
              (in_stack_fffffffffffffae0,
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_68);
      if (!bVar1) break;
      anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x11b9a8);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffaf0,(char *)in_stack_fffffffffffffae8,
                 (int)((ulong)in_stack_fffffffffffffae0 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                 (char *)0x11b9c1);
      QMessageLogger::warning();
      QDebug::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffb20.m_data);
      QDebug::operator<<((QDebug *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
      QDebug::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffb20.m_data);
      QDebug::~QDebug(local_1f8);
      local_60 = local_60 & 0xffffffffffffff00;
    }
  }
  else {
    local_220[0] = 0xaaaaaaaaaaaaaaaa;
    QIODevice::readAll();
    QJsonDocument::fromJson((QByteArray *)local_220,local_238);
    QByteArray::~QByteArray((QByteArray *)0x11ba7d);
    uVar4 = QJsonDocument::isObject();
    if ((uVar4 & 1) == 0) {
      local_78 = 0xaaaaaaaaaaaaaaaa;
      local_70 = 0xaaaaaaaaaaaaaaaa;
      qLcKmsDebug();
      anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                (in_stack_fffffffffffffae0,
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
      while( true ) {
        bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                          ((QLoggingCategoryMacroHolder *)&local_78);
        if (!bVar1) break;
        anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x11bae8);
        QMessageLogger::QMessageLogger
                  (in_stack_fffffffffffffaf0,(char *)in_stack_fffffffffffffae8,
                   (int)((ulong)in_stack_fffffffffffffae0 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                   (char *)0x11bb01);
        QMessageLogger::warning();
        QDebug::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffb20.m_data);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
        QDebug::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffb20.m_data);
        QDebug::~QDebug(&local_240);
        local_70 = local_70 & 0xffffffffffffff00;
      }
    }
    else {
      local_268[0] = 0xaaaaaaaaaaaaaaaa;
      QJsonDocument::object();
      local_280 = 0xaaaaaaaaaaaaaaaa;
      local_278 = 0xaaaaaaaaaaaaaaaa;
      local_270 = 0xaaaaaaaaaaaaaaaa;
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffae8,(size_t)in_stack_fffffffffffffae0);
      QVar8.m_data = (char *)local_268;
      QVar8.m_size = (qsizetype)local_90;
      QJsonObject::value(QVar8);
      QJsonValue::toString();
      QJsonValue::~QJsonValue(local_90);
      local_298 = 0xaaaaaaaaaaaaaaaa;
      local_290 = 0xaaaaaaaaaaaaaaaa;
      local_288 = 0xaaaaaaaaaaaaaaaa;
      QString::toUtf8((QString *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
      local_2a0 = 0xaaaaaaaaaaaaaaaa;
      QSize::QSize((QSize *)in_stack_fffffffffffffae0);
      this_00 = (QAnyStringView *)QByteArray::constData((QByteArray *)0x11bc97);
      this_01 = (QMessageLogger *)QSize::rwidth((QSize *)0x11bca9);
      piVar5 = QSize::rheight((QSize *)0x11bcbb);
      iVar3 = __isoc99_sscanf(this_00,"%dx%d",this_01,piVar5);
      if (iVar3 == 2) {
        *(undefined1 *)&in_RDI[1].d.ptr = 1;
        *(undefined8 *)((long)&in_RDI[1].d.ptr + 4) = local_2a0;
      }
      else {
        *(undefined1 *)&in_RDI[1].d.ptr = 0;
      }
      Qt::Literals::StringLiterals::operator____L1
                ((char *)this_00,(size_t)in_stack_fffffffffffffae0);
      QVar9.m_data = (char *)local_268;
      QVar9.m_size = (qsizetype)local_a8;
      QJsonObject::value(QVar9);
      bVar2 = QJsonValue::toBool(SUB81(local_a8,0));
      *(byte *)((long)&in_RDI[1].d.size + 4) = bVar2 & 1;
      QJsonValue::~QJsonValue(local_a8);
      Qt::Literals::StringLiterals::operator____L1
                ((char *)this_00,(size_t)in_stack_fffffffffffffae0);
      QVar10.m_data = (char *)local_268;
      QVar10.m_size = (qsizetype)local_c0;
      QJsonObject::value(QVar10);
      bVar2 = QJsonValue::toBool(SUB81(local_c0,0));
      *(byte *)((long)&in_RDI[1].d.size + 6) = bVar2 & 1;
      QJsonValue::~QJsonValue(local_c0);
      Qt::Literals::StringLiterals::operator____L1
                ((char *)this_00,(size_t)in_stack_fffffffffffffae0);
      QVar11.m_data = (char *)local_268;
      QVar11.m_size = (qsizetype)local_d8;
      QJsonObject::value(QVar11);
      QJsonValue::toString();
      QString::operator=((QString *)in_stack_fffffffffffffae0,
                         (QString *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
      QString::~QString((QString *)0x11be6d);
      QJsonValue::~QJsonValue(local_d8);
      Qt::Literals::StringLiterals::operator____L1
                ((char *)this_00,(size_t)in_stack_fffffffffffffae0);
      QVar12.m_data = (char *)local_268;
      QVar12.m_size = (qsizetype)local_f0;
      QJsonObject::value(QVar12);
      bVar2 = QJsonValue::toBool(SUB81(local_f0,0));
      *(byte *)((long)&in_RDI[1].d.size + 5) = bVar2 & 1;
      QJsonValue::~QJsonValue(local_f0);
      local_2c8._0_8_ = 0xaaaaaaaaaaaaaaaa;
      local_2c8._8_8_ = 0xaaaaaaaaaaaaaaaa;
      Qt::Literals::StringLiterals::operator____L1
                ((char *)this_00,(size_t)in_stack_fffffffffffffae0);
      QVar13.m_data = (char *)local_268;
      QVar13.m_size = (qsizetype)local_108;
      QJsonObject::value(QVar13);
      QAnyStringView::QAnyStringView(&local_2d8);
      local_2c8 = QJsonValue::toStringView((QAnyStringView *)local_108);
      QJsonValue::~QJsonValue(local_108);
      bVar1 = QAnyStringView::isEmpty((QAnyStringView *)0x11bf9a);
      if (!bVar1) {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)this_00,(size_t)in_stack_fffffffffffffae0);
        str_00.m_data = (char *)in_RDI;
        str_00.m_size = (qsizetype)this_01;
        QAnyStringView::QAnyStringView(this_00,str_00);
        bVar1 = operator==((QAnyStringView *)in_stack_fffffffffffffae0,
                           (QAnyStringView *)
                           CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
        if (bVar1) {
          *(undefined4 *)&in_RDI[2].d.d = 0;
        }
        else {
          in_stack_fffffffffffffb20 =
               Qt::Literals::StringLiterals::operator____L1
                         ((char *)this_00,(size_t)in_stack_fffffffffffffae0);
          str_01.m_data = (char *)in_RDI;
          str_01.m_size = (qsizetype)this_01;
          QAnyStringView::QAnyStringView(this_00,str_01);
          bVar1 = operator==((QAnyStringView *)in_stack_fffffffffffffae0,
                             (QAnyStringView *)
                             CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
          if (bVar1) {
            *(undefined4 *)&in_RDI[2].d.d = 1;
          }
          else {
            local_118 = 0xaaaaaaaaaaaaaaaa;
            local_110 = 0xaaaaaaaaaaaaaaaa;
            qLcKmsDebug();
            anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)1>::
            QLoggingCategoryMacroHolder
                      (in_stack_fffffffffffffae0,
                       (QLoggingCategory *)
                       CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
            while( true ) {
              bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                ((QLoggingCategoryMacroHolder *)&local_118);
              if (!bVar1) break;
              anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                        ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x11c0b4);
              QMessageLogger::QMessageLogger
                        (this_01,(char *)this_00,(int)((ulong)in_stack_fffffffffffffae0 >> 0x20),
                         (char *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                         (char *)0x11c0cd);
              QAnyStringView::toString((QAnyStringView *)in_stack_fffffffffffffae0);
              QtPrivate::asString(&local_330);
              uVar6 = QString::utf16();
              QMessageLogger::warning(local_318,"Unknown virtualDesktopOrientation value %ls",uVar6)
              ;
              QString::~QString((QString *)0x11c11d);
              local_110 = local_110 & 0xffffffffffffff00;
            }
          }
        }
      }
      local_338 = 0xaaaaaaaaaaaaaaaa;
      Qt::Literals::StringLiterals::operator____L1
                ((char *)this_00,(size_t)in_stack_fffffffffffffae0);
      QVar14.m_data = (char *)local_268;
      QVar14.m_size = (qsizetype)local_130;
      QJsonObject::value(QVar14);
      QJsonValue::toArray();
      QJsonValue::~QJsonValue(local_130);
      local_4f4 = 0;
      while( true ) {
        this_02 = (QArrayDataPointer<char16_t> *)(long)local_4f4;
        lVar7 = QJsonArray::size();
        if (lVar7 <= (long)this_02) break;
        local_340 = 0xaaaaaaaaaaaaaaaa;
        QJsonArray::at((longlong)local_148);
        QJsonValue::toObject();
        QJsonObject::toVariantMap();
        QJsonObject::~QJsonObject(local_348);
        QJsonValue::~QJsonValue(local_148);
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_378,(Data *)0x0,L"name",4);
        QString::QString((QString *)this_02,
                         (DataPointer *)
                         CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
        bVar1 = QMap<QString,_QVariant>::contains
                          ((QMap<QString,_QVariant> *)this_01,(QString *)this_00);
        in_stack_fffffffffffffadc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffadc);
        QString::~QString((QString *)0x11c2c0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(this_02);
        if ((in_stack_fffffffffffffadc & 0x1000000) != NotOpen) {
          local_390 = 0xaaaaaaaaaaaaaaaa;
          local_388 = 0xaaaaaaaaaaaaaaaa;
          local_380 = 0xaaaaaaaaaaaaaaaa;
          QArrayDataPointer<char16_t>::QArrayDataPointer(local_3c0,(Data *)0x0,L"name",4);
          QString::QString((QString *)this_02,
                           (DataPointer *)
                           CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
          QVariant::QVariant((QVariant *)0x11c376);
          QMap<QString,_QVariant>::value
                    ((QMap<QString,_QVariant> *)in_stack_fffffffffffffb00._M_node,in_RDI,
                     (QVariant *)this_01);
          QVariant::toString();
          QVariant::~QVariant(&local_28);
          QVariant::~QVariant(&local_48);
          QString::~QString((QString *)0x11c3d7);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(this_02);
          bVar1 = QMap<QString,_QMap<QString,_QVariant>_>::contains
                            ((QMap<QString,_QMap<QString,_QVariant>_> *)this_01,(QString *)this_00);
          if (bVar1) {
            local_158 = 0xaaaaaaaaaaaaaaaa;
            local_150 = 0xaaaaaaaaaaaaaaaa;
            qLcKmsDebug();
            anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::
            QLoggingCategoryMacroHolder
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)this_02,
                       (QLoggingCategory *)
                       CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
            while( true ) {
              bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                ((QLoggingCategoryMacroHolder *)&local_158);
              if (!bVar1) break;
              anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                        ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x11c459);
              QMessageLogger::QMessageLogger
                        (this_01,(char *)this_00,(int)((ulong)this_02 >> 0x20),
                         (char *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                         (char *)0x11c472);
              QMessageLogger::debug();
              QDebug::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffb20.m_data);
              QDebug::operator<<((QDebug *)this_01,(QString *)this_00);
              QDebug::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffb20.m_data);
              QDebug::~QDebug(&local_3c8);
              local_150 = local_150 & 0xffffffffffffff00;
            }
          }
          in_stack_fffffffffffffb00._M_node =
               (_Base_ptr)
               QMap<QString,_QMap<QString,_QVariant>_>::insert
                         ((QMap<QString,_QMap<QString,_QVariant>_> *)this_01,(QString *)this_00,
                          (QMap<QString,_QVariant> *)this_02);
          QString::~QString((QString *)0x11c506);
        }
        QMap<QString,_QVariant>::~QMap((QMap<QString,_QVariant> *)0x11c513);
        local_4f4 = local_4f4 + 1;
      }
      local_168 = 0xaaaaaaaaaaaaaaaa;
      local_160 = 0xaaaaaaaaaaaaaaaa;
      qLcKmsDebug();
      anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)this_02,
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
      while( true ) {
        bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                          ((QLoggingCategoryMacroHolder *)&local_168);
        if (!bVar1) break;
        anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x11c579);
        QMessageLogger::QMessageLogger
                  (this_01,(char *)this_00,(int)((ulong)this_02 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                   (char *)0x11c592);
        QMessageLogger::debug();
        QDebug::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffb20.m_data);
        QDebug::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffb20.m_data);
        QDebug::operator<<((QDebug *)this_02,SUB41(in_stack_fffffffffffffadc >> 0x18,0));
        QDebug::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffb20.m_data);
        QDebug::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffb20.m_data);
        QDebug::operator<<((QDebug *)this_02,SUB41(in_stack_fffffffffffffadc >> 0x18,0));
        QDebug::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffb20.m_data);
        QDebug::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffb20.m_data);
        QDebug::operator<<((QDebug *)this_02,SUB41(in_stack_fffffffffffffadc >> 0x18,0));
        QDebug::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffb20.m_data);
        QDebug::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffb20.m_data);
        QDebug::operator<<((QDebug *)this_02,SUB41(in_stack_fffffffffffffadc >> 0x18,0));
        QDebug::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffb20.m_data);
        QDebug::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffb20.m_data);
        QDebug::operator<<((QDebug *)this_02,in_stack_fffffffffffffadc);
        QDebug::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffb20.m_data);
        o = QDebug::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffb20.m_data);
        QDebug::QDebug(&local_3f8,o);
        ::operator<<((QDebug *)in_RDI,(QMap<QString,_QMap<QString,_QVariant>_> *)this_01);
        QDebug::~QDebug(local_3f0);
        QDebug::~QDebug(&local_3f8);
        QDebug::~QDebug(&local_400);
        local_160 = local_160 & 0xffffffffffffff00;
      }
      QJsonArray::~QJsonArray((QJsonArray *)&local_338);
      QByteArray::~QByteArray((QByteArray *)0x11c740);
      QString::~QString((QString *)0x11c74d);
      QJsonObject::~QJsonObject((QJsonObject *)local_268);
    }
    QJsonDocument::~QJsonDocument((QJsonDocument *)local_220);
  }
  QFile::~QFile((QFile *)&local_1d0);
LAB_0011c77f:
  QByteArray::~QByteArray((QByteArray *)0x11c78c);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QKmsScreenConfig::loadConfig()
{
    QByteArray json = qgetenv("QT_QPA_EGLFS_KMS_CONFIG");
    if (json.isEmpty()) {
        json = qgetenv("QT_QPA_KMS_CONFIG");
        if (json.isEmpty())
            return;
    }

    qCDebug(qLcKmsDebug) << "Loading KMS setup from" << json;

    QFile file(QString::fromUtf8(json));
    if (!file.open(QFile::ReadOnly)) {
        qCWarning(qLcKmsDebug) << "Could not open config file"
                               << json << "for reading";
        return;
    }

    const QJsonDocument doc = QJsonDocument::fromJson(file.readAll());
    if (!doc.isObject()) {
        qCWarning(qLcKmsDebug) << "Invalid config file" << json
                              << "- no top-level JSON object";
        return;
    }

    const QJsonObject object = doc.object();

    const QString headlessStr = object.value("headless"_L1).toString();
    const QByteArray headless = headlessStr.toUtf8();
    QSize headlessSize;
    if (sscanf(headless.constData(), "%dx%d", &headlessSize.rwidth(), &headlessSize.rheight()) == 2) {
        m_headless = true;
        m_headlessSize = headlessSize;
    } else {
        m_headless = false;
    }

    m_hwCursor = object.value("hwcursor"_L1).toBool(m_hwCursor);
    m_pbuffers = object.value("pbuffers"_L1).toBool(m_pbuffers);
    m_devicePath = object.value("device"_L1).toString();
    m_separateScreens = object.value("separateScreens"_L1).toBool(m_separateScreens);

    const auto vdOriString = object.value("virtualDesktopLayout"_L1).toStringView();
    if (!vdOriString.isEmpty()) {
        if (vdOriString == "horizontal"_L1)
            m_virtualDesktopLayout = VirtualDesktopLayoutHorizontal;
        else if (vdOriString == "vertical"_L1)
            m_virtualDesktopLayout = VirtualDesktopLayoutVertical;
        else
            qCWarning(qLcKmsDebug, "Unknown virtualDesktopOrientation value %ls",
                      qUtf16Printable(vdOriString.toString()));
    }

    const QJsonArray outputs = object.value("outputs"_L1).toArray();
    for (int i = 0; i < outputs.size(); i++) {
        const QVariantMap outputSettings = outputs.at(i).toObject().toVariantMap();

        if (outputSettings.contains(QStringLiteral("name"))) {
            const QString name = outputSettings.value(QStringLiteral("name")).toString();

            if (m_outputSettings.contains(name)) {
                qCDebug(qLcKmsDebug) << "Output" << name << "configured multiple times!";
            }

            m_outputSettings.insert(name, outputSettings);
        }
    }

    qCDebug(qLcKmsDebug) << "Requested configuration (some settings may be ignored):\n"
                         << "\theadless:" << m_headless << "\n"
                         << "\thwcursor:" << m_hwCursor << "\n"
                         << "\tpbuffers:" << m_pbuffers << "\n"
                         << "\tseparateScreens:" << m_separateScreens << "\n"
                         << "\tvirtualDesktopLayout:" << m_virtualDesktopLayout << "\n"
                         << "\toutputs:" << m_outputSettings;
}